

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp2.c
# Opt level: O0

void ssh2_bpp_format_packet(ssh2_bpp_state *s,PktOut *pkt)

{
  size_t sVar1;
  int iVar2;
  ssh_cipheralg *psVar3;
  ssh2_macalg *psVar4;
  PktOut *pkt_00;
  int local_3c;
  ulong local_38;
  size_t i;
  size_t origlen;
  PktOut *ignore_pkt;
  int length;
  int block;
  PktOut *pkt_local;
  ssh2_bpp_state *s_local;
  
  if ((pkt->minlen != 0) && (s->out_comp == (ssh_compressor *)0x0)) {
    if ((s->out).cipher == (ssh_cipher *)0x0) {
      local_3c = 0;
    }
    else {
      psVar3 = ssh_cipher_alg((s->out).cipher);
      local_3c = psVar3->blksize;
    }
    ignore_pkt._4_4_ = local_3c;
    if (local_3c < 8) {
      ignore_pkt._4_4_ = 8;
    }
    iVar2 = ignore_pkt._4_4_ + (int)pkt->length + 3;
    ignore_pkt._0_4_ = iVar2 - iVar2 % ignore_pkt._4_4_;
    if ((s->out).mac != (ssh2_mac *)0x0) {
      psVar4 = ssh2_mac_alg((s->out).mac);
      ignore_pkt._0_4_ = psVar4->len + (int)ignore_pkt;
    }
    if ((ulong)(long)(int)ignore_pkt < pkt->minlen) {
      ignore_pkt._0_4_ = (int)pkt->minlen - (int)ignore_pkt;
      if ((s->out).mac != (ssh2_mac *)0x0) {
        psVar4 = ssh2_mac_alg((s->out).mac);
        ignore_pkt._0_4_ = (int)ignore_pkt - psVar4->len;
      }
      ignore_pkt._0_4_ = (int)ignore_pkt + -0xd;
      if ((int)ignore_pkt < 0) {
        ignore_pkt._0_4_ = 0;
      }
      pkt_00 = ssh2_bpp_new_pktout(2);
      BinarySink_put_uint32(pkt_00->binarysink_,(long)(int)ignore_pkt);
      sVar1 = pkt_00->length;
      for (local_38 = 0; local_38 < (ulong)(long)(int)ignore_pkt; local_38 = local_38 + 1) {
        BinarySink_put_byte(pkt_00->binarysink_,'\0');
      }
      random_read(pkt_00->data + sVar1,(long)(int)ignore_pkt);
      ssh2_bpp_format_packet_inner(s,pkt_00);
      bufchain_add((s->bpp).out_raw,pkt_00->data,pkt_00->length);
      ssh_free_pktout(pkt_00);
    }
  }
  ssh2_bpp_format_packet_inner(s,pkt);
  bufchain_add((s->bpp).out_raw,pkt->data,pkt->length);
  return;
}

Assistant:

static void ssh2_bpp_format_packet(struct ssh2_bpp_state *s, PktOut *pkt)
{
    if (pkt->minlen > 0 && !s->out_comp) {
        /*
         * If we've been told to pad the packet out to a given minimum
         * length, but we're not compressing (and hence can't get the
         * compression to do the padding by pointlessly opening and
         * closing zlib blocks), then our other strategy is to precede
         * this message with an SSH_MSG_IGNORE that makes it up to the
         * right length.
         *
         * A third option in principle, and the most obviously
         * sensible, would be to set the explicit padding field in the
         * packet to more than its minimum value. Sadly, that turns
         * out to break some servers (our institutional memory thinks
         * Cisco in particular) and so we abandoned that idea shortly
         * after trying it.
         */

        /*
         * Calculate the length we expect the real packet to have.
         */
        int block, length;
        PktOut *ignore_pkt;

        block = s->out.cipher ? ssh_cipher_alg(s->out.cipher)->blksize : 0;
        if (block < 8)
            block = 8;
        length = pkt->length;
        length += 4;       /* minimum 4 byte padding */
        length += block-1;
        length -= (length % block);
        if (s->out.mac)
            length += ssh2_mac_alg(s->out.mac)->len;

        if (length < pkt->minlen) {
            /*
             * We need an ignore message. Calculate its length.
             */
            length = pkt->minlen - length;

            /*
             * And work backwards from that to the length of the
             * contained string.
             */
            if (s->out.mac)
                length -= ssh2_mac_alg(s->out.mac)->len;
            length -= 8;               /* length field + min padding */
            length -= 5;               /* type code + string length prefix */

            if (length < 0)
                length = 0;

            ignore_pkt = ssh2_bpp_new_pktout(SSH2_MSG_IGNORE);
            put_uint32(ignore_pkt, length);
            size_t origlen = ignore_pkt->length;
            for (size_t i = 0; i < length; i++)
                put_byte(ignore_pkt, 0);  /* make space for random padding */
            random_read(ignore_pkt->data + origlen, length);
            ssh2_bpp_format_packet_inner(s, ignore_pkt);
            bufchain_add(s->bpp.out_raw, ignore_pkt->data, ignore_pkt->length);
            ssh_free_pktout(ignore_pkt);
        }
    }

    ssh2_bpp_format_packet_inner(s, pkt);
    bufchain_add(s->bpp.out_raw, pkt->data, pkt->length);
}